

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O1

rt_expr<viennamath::rt_expression_interface<double>_> * __thiscall
viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
          (rt_expr<viennamath::rt_expression_interface<double>> *this,ct_constant<8L> *param_1)

{
  long *plVar1;
  long *plVar2;
  
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR__rt_expression_interface_001167a0;
  plVar2[1] = 0x4020000000000000;
  plVar1 = *(long **)this;
  if (plVar1 != plVar2) {
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    *(long **)this = plVar2;
  }
  return (rt_expr<viennamath::rt_expression_interface<double>_> *)this;
}

Assistant:

rt_expr & operator=(ct_constant<value> const & /*other*/)
      {
        rt_expr_ = std::auto_ptr<InterfaceType>(new rt_constant<numeric_type>(value));
        return *this;
      }